

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PathTests.cpp
# Opt level: O3

void __thiscall
agge::tests::PathGeneratorAdapterTests::EmptySourcePathAddsNothingToGenerator
          (PathGeneratorAdapterTests *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  int iVar3;
  FailedAssertion *pFVar4;
  real_t y;
  real_t x;
  path empty;
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  pg;
  string local_120;
  string local_100;
  real_t local_e0;
  real_t local_dc;
  passthrough_generator local_d8;
  LocationInfo local_b0;
  vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_> local_88
  ;
  size_t sStack_70;
  path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
  local_68;
  
  local_88.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  sStack_70 = 0;
  local_88.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_88.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_d8.super_path.position = 0;
  local_d8.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.super_path.points.
  super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.kx = 1.0;
  local_d8.ky = 1.0;
  std::vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>::
  vector((vector<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
          *)&local_68,&local_88);
  local_68._source.position = sStack_70;
  local_68._generator = &local_d8;
  local_68._state = 0;
  iVar3 = path_generator_adapter<agge::tests::mocks::path,_agge::tests::(anonymous_namespace)::passthrough_generator>
          ::vertex(&local_68,&local_dc,&local_e0);
  paVar1 = &local_120.field_2;
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b0,&local_120,0x39);
  if (iVar3 != 0) {
    pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
    local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,"Values are not equal!","")
    ;
    ut::FailedAssertion::FailedAssertion(pFVar4,&local_100,&local_b0);
    __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
  }
  paVar2 = &local_b0.filename.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0.filename._M_dataplus._M_p != paVar2) {
    operator_delete(local_b0.filename._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_120._M_dataplus._M_p != paVar1) {
    operator_delete(local_120._M_dataplus._M_p);
  }
  local_120._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_120,
             "/workspace/llm4binary/github/license_c_cmakelists/tyoma[P]agge/tests/agge/PathTests.cpp"
             ,"");
  ut::LocationInfo::LocationInfo(&local_b0,&local_120,0x3c);
  if (local_d8.super_path.points.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      local_d8.super_path.points.
      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0.filename._M_dataplus._M_p != paVar2) {
      operator_delete(local_b0.filename._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != paVar1) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_68._source.points.
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_68._source.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_d8.super_path.points.
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_d8.super_path.points.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_88.
        super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_88.
                      super__Vector_base<agge::tests::mocks::path::point,_std::allocator<agge::tests::mocks::path::point>_>
                      ._M_impl.super__Vector_impl_data._M_start);
    }
    return;
  }
  pFVar4 = (FailedAssertion *)__cxa_allocate_exception(0x38);
  local_100._M_dataplus._M_p = (pointer)&local_100.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_100,"The container is not empty!","");
  ut::FailedAssertion::FailedAssertion(pFVar4,&local_100,&local_b0);
  __cxa_throw(pFVar4,&ut::FailedAssertion::typeinfo,ut::FailedAssertion::~FailedAssertion);
}

Assistant:

test( EmptySourcePathAddsNothingToGenerator )
			{
				// INIT
				const mocks::path empty;
				passthrough_generator g(1.0f, 1.0f);
				real_t x, y;

				// INIT / ACT
				path_generator_adapter<mocks::path, passthrough_generator> pg = assist(empty, g);

				// ACT / ASSERT
				assert_equal(path_command_stop, (int)pg.vertex(&x, &y));

				// ASSERT
				assert_is_empty(g.points);
			}